

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OdiPublisher.cpp
# Opt level: O3

bool OdiPublisher::PublishMetricFile
               (char *metric_file_name,char *odi_dir,char *data_dir,time_t current_time)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int metric_id;
  int day;
  int month;
  int year;
  size_t name_offset;
  char odi_file_name [512];
  char json_file_name [512];
  
  bVar2 = false;
  metric_id = 0;
  year = 0;
  month = 0;
  day = 0;
  name_offset = 0;
  bVar1 = ithimetrics::ParseMetricFileName
                    (metric_file_name,&metric_id,&year,&month,&day,&name_offset);
  if (bVar1) {
    bVar2 = false;
    iVar3 = snprintf(odi_file_name,0x200,"%s%sITHI-M%1d%s%04d%02d%02d-2359.csv",odi_dir,"/",
                     (ulong)(uint)metric_id,"/",(ulong)(uint)year,(ulong)(uint)month,
                     (ulong)(uint)day);
    if (0 < iVar3) {
      bVar1 = CopyFile(metric_file_name,odi_file_name);
      if (bVar1) {
        bVar2 = false;
        iVar3 = snprintf(json_file_name,0x200,"%s-metadata.json",odi_file_name);
        if (0 < iVar3) {
          bVar2 = CopyUpdateJsonFile(metric_id,json_file_name,data_dir,current_time);
        }
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool OdiPublisher::PublishMetricFile(const char * metric_file_name, char const * odi_dir, char const * data_dir, time_t current_time)
{
    char odi_file_name[512];
    char json_file_name[512];
    int metric_id = 0;
    int year = 0;
    int month = 0;
    int day = 0;
    size_t name_offset = 0;
    bool ret;

    /* Parse the file name, obtain metric and date */
    ret = ithimetrics::ParseMetricFileName(metric_file_name, &metric_id, &year, &month, &day, &name_offset);

    /* Get the oid metric name */
    if (ret) {
        ret = snprintf(odi_file_name, sizeof(odi_file_name), "%s%sITHI-M%1d%s%04d%02d%02d-2359.csv",
            odi_dir, ITHI_FILE_PATH_SEP, metric_id, ITHI_FILE_PATH_SEP, year, month, day) > 0;
    }

    /* Copy the metric file */
    if (ret) {
        ret = CopyFile(metric_file_name, odi_file_name);
    }

    /* Get the JSON file name and copy it */
    if (ret) {
        ret = (snprintf(json_file_name, sizeof(json_file_name), "%s-metadata.json", odi_file_name) > 0);

        if (ret) {
            ret = CopyUpdateJsonFile(metric_id, json_file_name, data_dir, current_time);
        }
    }


    return ret;
}